

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,uncertain_measurement *measure,
          uint64_t match_flags)

{
  ostream *poVar1;
  uint64_t match_flags_00;
  uint64_t uVar2;
  double dVar3;
  undefined8 local_1d8;
  string local_1d0;
  stringstream ss;
  uint64_t uStack_1a8;
  ostream local_1a0 [376];
  
  dVar3 = uncertain_measurement::fractional_uncertainty((uncertain_measurement *)this);
  dVar3 = log10(dVar3);
  dVar3 = ceil(-dVar3);
  match_flags_00 = (long)dVar3 + 1;
  uVar2 = 2;
  if (1 < (long)dVar3) {
    uVar2 = match_flags_00;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint64_t *)((long)&uStack_1a8 + *(long *)(_ss + -0x18)) = uVar2;
  std::ostream::operator<<(local_1a0,*(float *)this);
  std::operator<<(local_1a0,"+/-");
  *(undefined8 *)((long)&uStack_1a8 + *(long *)(_ss + -0x18)) = 2;
  poVar1 = (ostream *)std::ostream::operator<<(local_1a0,*(float *)(this + 4));
  std::operator<<(poVar1,' ');
  *(uint64_t *)((long)&uStack_1a8 + *(long *)(_ss + -0x18)) = uVar2;
  local_1d8 = *(undefined8 *)(this + 8);
  to_string_abi_cxx11_(&local_1d0,(units *)&local_1d8,(unit *)measure,match_flags_00);
  std::operator<<(local_1a0,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string
    to_string(const uncertain_measurement& measure, std::uint64_t match_flags)
{
    // compute the correct number of digits to display for uncertain precision
    auto digits = static_cast<std::streamsize>(
        ceil(-log10(measure.fractional_uncertainty())));
    digits = (digits < 2) ? 2 : digits + 1;
    std::stringstream ss;
    ss.precision(digits);
    ss << measure.value_f();
    ss << "+/-";
    ss.precision(2);
    ss << measure.uncertainty_f() << ' ';
    ss.precision(digits);
    ss << to_string(measure.units(), match_flags);
    return ss.str();
}